

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

flatcc_builder_vt_ref_t
flatcc_builder_create_cached_vtable
          (flatcc_builder_t *B,flatbuffers_voffset_t *vt,flatbuffers_voffset_t vt_size,
          uint32_t vt_hash)

{
  flatbuffers_uoffset_t *pfVar1;
  flatbuffers_uoffset_t fVar2;
  void *pvVar3;
  int iVar4;
  flatcc_builder_vt_ref_t fVar5;
  ulong uVar6;
  size_t sVar7;
  flatcc_builder_vt_ref_t *pfVar8;
  flatcc_builder_vt_ref_t *pfVar9;
  ulong uVar10;
  uint uVar11;
  flatcc_builder_vt_ref_t fVar12;
  void *pvVar13;
  flatbuffers_uoffset_t *pfVar14;
  
  sVar7 = B->ht_width;
  if (sVar7 == 0) {
    if (B->vd_end != 0) {
      __assert_fail("B->vd_end == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x15e,"int alloc_ht(flatcc_builder_t *)");
    }
    if ((B->buffers[6].iov_len < 0x10) &&
       (iVar4 = (*B->alloc)(B->alloc_context,B->buffers + 6,0x10,0,6), iVar4 != 0))
    goto LAB_00105696;
    if (B->buffers[6].iov_base == (void *)0x0) {
      return 0;
    }
    B->vd_end = 0x10;
    iVar4 = (*B->alloc)(B->alloc_context,B->buffers + 5,0x100,1,5);
    if (iVar4 != 0) {
      return 0;
    }
    uVar6 = 0x100;
    do {
      uVar10 = uVar6;
      uVar6 = uVar10 * 2;
    } while (uVar6 <= B->buffers[5].iov_len);
    sVar7 = 0xffffffffffffffff;
    do {
      sVar7 = sVar7 + 1;
    } while ((ulong)(1L << ((byte)sVar7 & 0x3f)) < uVar10 >> 2);
    B->ht_width = sVar7;
  }
  pvVar13 = B->buffers[5].iov_base;
  if (pvVar13 == (void *)0x0) {
    fVar12 = 0;
  }
  else {
    pfVar1 = (flatbuffers_uoffset_t *)
             ((long)pvVar13 + (ulong)(vt_hash >> (-(char)sVar7 & 0x1fU)) * 4);
    uVar11 = *pfVar1;
    uVar6 = (ulong)vt_size;
    if (uVar11 == 0) {
      pfVar9 = (flatcc_builder_vt_ref_t *)0x0;
    }
    else {
      pvVar13 = B->buffers[2].iov_base;
      pvVar3 = B->buffers[6].iov_base;
      pfVar14 = pfVar1;
      pfVar9 = (flatcc_builder_vt_ref_t *)0x0;
      do {
        while( true ) {
          pfVar8 = (flatcc_builder_vt_ref_t *)((long)pvVar3 + (ulong)uVar11);
          uVar10 = (ulong)*(uint *)((long)pvVar3 + (ulong)uVar11 + 8);
          if ((*(flatbuffers_voffset_t *)(uVar10 + (long)pvVar13) == vt_size) &&
             (iVar4 = bcmp(vt,(void *)(uVar10 + (long)pvVar13),uVar6), iVar4 == 0)) break;
          uVar11 = pfVar8[3];
          pfVar14 = (flatbuffers_uoffset_t *)(pfVar8 + 3);
          if (uVar11 == 0) goto LAB_00105514;
        }
        if (pfVar8[1] == B->nest_id) {
          if (pfVar14 != pfVar1) {
            *pfVar14 = pfVar8[3];
            pfVar8[3] = *pfVar1;
            *pfVar1 = uVar11;
          }
          goto LAB_0010565e;
        }
        uVar11 = pfVar8[3];
        pfVar14 = (flatbuffers_uoffset_t *)(pfVar8 + 3);
        pfVar9 = pfVar8;
      } while (uVar11 != 0);
    }
LAB_00105514:
    uVar11 = B->vd_end;
    uVar10 = (ulong)uVar11 + 0x10;
    if ((B->buffers[6].iov_len < uVar10) &&
       (iVar4 = (*B->alloc)(B->alloc_context,B->buffers + 6,uVar10,0,6), iVar4 != 0)) {
LAB_00105696:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x13c,"void *reserve_buffer(flatcc_builder_t *, int, size_t, size_t, int)");
    }
    pfVar8 = (flatcc_builder_vt_ref_t *)((ulong)uVar11 + (long)B->buffers[6].iov_base);
    fVar12 = 0;
    if (pfVar8 != (flatcc_builder_vt_ref_t *)0x0) {
      fVar2 = B->vd_end;
      B->vd_end = fVar2 + 0x10;
      pfVar8[1] = B->nest_id;
      pfVar8[3] = *pfVar1;
      *pfVar1 = fVar2;
      fVar5 = flatcc_builder_create_vtable(B,vt,vt_size);
      *pfVar8 = fVar5;
      fVar12 = 0;
      if (fVar5 != 0) {
        if (pfVar9 == (flatcc_builder_vt_ref_t *)0x0) {
          uVar11 = B->vb_end;
          if ((B->vb_flush_limit == 0) || ((ulong)(vt_size + uVar11) <= B->vb_flush_limit)) {
            uVar10 = uVar11 + uVar6;
            if ((B->buffers[2].iov_len < uVar10) &&
               (iVar4 = (*B->alloc)(B->alloc_context,B->buffers + 2,uVar10,0,2), iVar4 != 0))
            goto LAB_00105696;
            pvVar13 = (void *)((ulong)uVar11 + (long)B->buffers[2].iov_base);
            if (pvVar13 == (void *)0x0) {
              return -1;
            }
            fVar2 = B->vb_end;
            pfVar8[2] = fVar2;
            B->vb_end = vt_size + fVar2;
            memcpy(pvVar13,vt,uVar6);
          }
          else if (B->ht_width != 0) {
            memset(B->buffers[5].iov_base,0,B->buffers[5].iov_len);
            B->vb_end = 0;
            B->vd_end = 0x10;
          }
        }
        else {
          pfVar8[2] = pfVar9[2];
        }
LAB_0010565e:
        fVar12 = *pfVar8;
      }
    }
  }
  return fVar12;
}

Assistant:

flatcc_builder_vt_ref_t flatcc_builder_create_cached_vtable(flatcc_builder_t *B,
        const voffset_t *vt, voffset_t vt_size, uint32_t vt_hash)
{
    vtable_descriptor_t *vd, *vd2;
    uoffset_t *pvd, *pvd_head;
    uoffset_t next;
    voffset_t *vt_;

    /* This just gets the hash table slot, we still have to inspect it. */
    if (!(pvd_head = lookup_ht(B, vt_hash))) {
        return 0;
    }
    pvd = pvd_head;
    next = *pvd;
    /* Tracks if there already is a cached copy. */
    vd2 = 0;
    while (next) {
        vd = vd_ptr(next);
        vt_ = vb_ptr(vd->vb_start);
        if (vt_[0] != vt_size || 0 != memcmp(vt, vt_, vt_size)) {
            pvd = &vd->next;
            next = vd->next;
            continue;
        }
        /* Can't share emitted vtables between buffers, */
        if (vd->nest_id != B->nest_id) {
            /* but we don't have to resubmit to cache. */
            vd2 = vd;
            /* See if there is a better match. */
            pvd = &vd->next;
            next = vd->next;
            continue;
        }
        /* Move to front hash strategy. */
        if (pvd != pvd_head) {
            *pvd = vd->next;
            vd->next = *pvd_head;
            *pvd_head = next;
        }
        /* vtable exists and has been emitted within current buffer. */
        return vd->vt_ref;
    }
    /* Allocate new descriptor. */
    if (!(vd = reserve_buffer(B, flatcc_builder_alloc_vd, B->vd_end, sizeof(vtable_descriptor_t), 0))) {
        return 0;
    }
    next = B->vd_end;
    B->vd_end += (uoffset_t)sizeof(vtable_descriptor_t);

    /* Identify the buffer this vtable descriptor belongs to. */
    vd->nest_id = B->nest_id;

    /* Move to front hash strategy. */
    vd->next = *pvd_head;
    *pvd_head = next;
    if (0 == (vd->vt_ref = flatcc_builder_create_vtable(B, vt, vt_size))) {
        return 0;
    }
    if (vd2) {
        /* Reuse cached copy. */
        vd->vb_start = vd2->vb_start;
    } else {
        if (B->vb_flush_limit && B->vb_flush_limit < B->vb_end + vt_size) {
            flatcc_builder_flush_vtable_cache(B);
        } else {
            /* Make space in vtable cache. */
            if (!(vt_ = reserve_buffer(B, flatcc_builder_alloc_vb, B->vb_end, vt_size, 0))) {
                return -1;
            }
            vd->vb_start = B->vb_end;
            B->vb_end += vt_size;
            memcpy(vt_, vt, vt_size);
        }
    }
    return vd->vt_ref;
}